

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

long count_deadends(void)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> this;
  pair<const_long,_Node> *node;
  iterator __end1;
  iterator __begin1;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *__range1;
  long total_deadends;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_18;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *local_10;
  long local_8;
  
  local_8 = 0;
  local_10 = &Node::nodes;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
       ::begin(in_stack_ffffffffffffffd8);
  this._M_cur = (__node_type *)
                std::
                unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                ::end(in_stack_ffffffffffffffd8);
  while (bVar1 = std::__detail::operator!=
                           (&local_18,
                            (_Node_iterator_base<std::pair<const_long,_Node>,_false> *)
                            &stack0xffffffffffffffe0), bVar1) {
    std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator*
              ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x1031fa);
    bVar1 = Edges::empty((Edges *)0x10320f);
    if (bVar1) {
      local_8 = local_8 + 1;
    }
    bVar1 = Edges::empty((Edges *)0x103234);
    if (bVar1) {
      local_8 = local_8 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)this._M_cur);
  }
  return local_8;
}

Assistant:

long count_deadends() {
    long total_deadends = 0;
    for (auto &node: Node::nodes) {
        if (node.second.left_edges.empty())
            total_deadends++;
        if (node.second.right_edges.empty())
            total_deadends++;
    }
    return total_deadends;
}